

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_10.cpp
# Opt level: O3

double permutations(int32_t a,int32_t b)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_EAX;
  undefined4 extraout_var;
  string local_30;
  
  if (b <= a) {
    iVar1 = factorial(a);
    iVar2 = factorial(a - b);
    return (double)iVar1 / (double)iVar2;
  }
  local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_30,
             "Permutation formula is: P(a,b) = a! / (a - b)!\nDifference (a - b) in denominator must be greater or equal to zero. Factorial is not defined for negative numbers."
             ,"");
  error(&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  _Unwind_Resume(CONCAT44(extraout_var,extraout_EAX));
}

Assistant:

double permutations(int32_t a, int32_t b)
{
	if (a < b)
		error(
			"Permutation formula is: P(a,b) = a! / (a - b)!\nDifference (a - b) in denominator must be greater or equal to zero. Factorial is not defined for negative numbers.");
	return double(factorial(a)) / factorial(a - b);
}